

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsRectVisible(ImVec2 *size)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = GImGui->CurrentWindow;
  fVar1 = (pIVar2->DC).CursorPos.y;
  if (((fVar1 < (pIVar2->ClipRect).Max.y) && ((pIVar2->ClipRect).Min.y < fVar1 + size->y)) &&
     (fVar1 = (pIVar2->DC).CursorPos.x, fVar1 < (pIVar2->ClipRect).Max.x)) {
    return (pIVar2->ClipRect).Min.x < fVar1 + size->x;
  }
  return false;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& size)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(window->DC.CursorPos, window->DC.CursorPos + size));
}